

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::FErrorFunc::checkArguments
          (FErrorFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5)

{
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  reference ppEVar2;
  SystemSubroutine *in_RCX;
  Args *in_RDX;
  undefined8 in_RSI;
  undefined1 isMethod;
  ASTContext *in_RDI;
  SourceLocation in_R8;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  Type *ft;
  Compilation *comp;
  Type *pTVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  DiagCode code;
  ASTContext *in_stack_ffffffffffffffa8;
  ASTContext *context_00;
  SourceLocation in_stack_fffffffffffffff8;
  
  isMethod = (undefined1)((ulong)in_RSI >> 0x38);
  context_00 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0xb2076f);
  pTVar3 = (Type *)0x2;
  callRange.endLoc = in_stack_fffffffffffffff8;
  callRange.startLoc = in_R8;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RCX,context_00,(bool)isMethod,in_RDX,callRange,in_stack_00000010,
                     in_stack_00000018);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xb207f4);
    bVar1 = Type::isIntegral(pTVar3);
    if (bVar1) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xb20852);
      bVar1 = Type::canBeStringLike(pTVar3);
      if (bVar1) {
        pTVar3 = Compilation::getIntegerType(this_00);
      }
      else {
        code.subsystem = SysFuncs;
        code.code = 0x1b;
        ppEVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            (in_RDX,1);
        ASTContext::addDiag(in_RDI,code,(*ppEVar2)->sourceRange);
        ast::operator<<((Diagnostic *)this_00,(Type *)in_R8);
        pTVar3 = Compilation::getErrorType(this_00);
      }
    }
    else {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      pTVar3 = SystemSubroutine::badArg
                         (in_RCX,in_stack_ffffffffffffffa8,
                          (Expression *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
  }
  else {
    pTVar3 = Compilation::getErrorType(this_00);
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, 2))
            return comp.getErrorType();

        if (!args[0]->type->isIntegral())
            return badArg(context, *args[0]);

        const Type& ft = *args[1]->type;
        if (!ft.canBeStringLike()) {
            context.addDiag(diag::InvalidStringArg, args[1]->sourceRange) << ft;
            return comp.getErrorType();
        }

        return comp.getIntegerType();
    }